

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

void __thiscall
llama_model_loader::init_mappings(llama_model_loader *this,bool prefetch,llama_mlocks *mlock_mmaps)

{
  llama_file *file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
  *pmVar1;
  llama_model_loader *plVar2;
  bool numa;
  undefined8 uVar3;
  code *pcVar4;
  llama_mmap *this_00;
  llama_mlock *this_01;
  EVP_PKEY_CTX *ctx;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  pointer puVar7;
  unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> mlock_mmap;
  unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> mapping;
  _Head_base<0UL,_llama_mlock_*,_false> local_78;
  _Head_base<0UL,_llama_mmap_*,_false> local_70;
  int local_64;
  llama_model_loader *local_60;
  vector<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>,std::allocator<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>>
  *local_58;
  size_t local_50;
  pointer local_48;
  vector<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>,std::allocator<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>>>
  *local_40;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_38;
  
  local_60 = this;
  local_58 = (vector<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>,std::allocator<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>>
              *)mlock_mmaps;
  if (this->use_mmap == true) {
    local_40 = (vector<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>,std::allocator<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>>>
                *)&this->mappings;
    std::
    vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
    ::reserve((vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
               *)local_40,
              (long)(this->files).
                    super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->files).
                    super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    local_38 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->mmaps_used;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_38,
              (long)(this->files).
                    super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->files).
                    super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar7 = (this->files).
             super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (this->files).
               super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar7 != local_48) {
      local_50 = -(ulong)prefetch;
      do {
        uVar3 = ggml_backend_dev_by_type(0);
        uVar3 = ggml_backend_dev_backend_reg(uVar3);
        pcVar4 = (code *)ggml_backend_reg_get_proc_address(uVar3,"ggml_backend_cpu_is_numa");
        file = (puVar7->_M_t).super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>.
               _M_t.super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
               super__Head_base<0UL,_llama_file_*,_false>._M_head_impl;
        numa = (bool)(*pcVar4)();
        this_00 = (llama_mmap *)operator_new(8);
        llama_mmap::llama_mmap(this_00,file,local_50,numa);
        local_70._M_head_impl = this_00;
        local_78._M_head_impl = (llama_mlock *)llama_mmap::size(this_00);
        local_64 = 0;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long,int>(local_38,(unsigned_long *)&local_78,&local_64);
        if (local_58 !=
            (vector<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>,std::allocator<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>>
             *)0x0) {
          this_01 = (llama_mlock *)operator_new(8);
          llama_mlock::llama_mlock(this_01);
          local_78._M_head_impl = this_01;
          ctx = (EVP_PKEY_CTX *)llama_mmap::addr(local_70._M_head_impl);
          llama_mlock::init(this_01,ctx);
          std::
          vector<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>,std::allocator<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>>
          ::emplace_back<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>
                    (local_58,(unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> *)
                              &local_78);
          std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>::~unique_ptr
                    ((unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> *)&local_78);
        }
        std::
        vector<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>,std::allocator<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>>>
        ::emplace_back<std::unique_ptr<llama_mmap,std::default_delete<llama_mmap>>>
                  (local_40,(unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)&local_70);
        std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::~unique_ptr
                  ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)&local_70);
        puVar7 = puVar7 + 1;
      } while (puVar7 != local_48);
    }
  }
  plVar2 = local_60;
  pmVar1 = &local_60->weights_map;
  for (p_Var6 = (local_60->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    lVar5 = ggml_nbytes(p_Var6[2]._M_left);
    plVar2->size_data = plVar2->size_data + lVar5;
  }
  return;
}

Assistant:

void llama_model_loader::init_mappings(bool prefetch, llama_mlocks * mlock_mmaps) {
    if (use_mmap) {
        mappings.reserve(files.size());
        mmaps_used.reserve(files.size());
        for (const auto & file : files) {
            auto * reg = ggml_backend_dev_backend_reg(ggml_backend_dev_by_type(GGML_BACKEND_DEVICE_TYPE_CPU));
            auto * is_numa_fn = (decltype(ggml_is_numa) *) ggml_backend_reg_get_proc_address(reg, "ggml_backend_cpu_is_numa");
            std::unique_ptr<llama_mmap> mapping = std::make_unique<llama_mmap>(file.get(), prefetch ? -1 : 0, is_numa_fn());
            mmaps_used.emplace_back(mapping->size(), 0);
            if (mlock_mmaps) {
                std::unique_ptr<llama_mlock> mlock_mmap(new llama_mlock());
                mlock_mmap->init(mapping->addr());
                mlock_mmaps->emplace_back(std::move(mlock_mmap));
            }
            mappings.emplace_back(std::move(mapping));
        }
    }

    // compute the total size of all tensors for progress reporting
    for (const auto & it : weights_map) {
        size_data += ggml_nbytes(it.second.tensor);
    }
}